

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

int rnndec_varmatch(rnndeccontext *ctx,rnnvarinfo *vi)

{
  int local_28;
  int local_24;
  int j;
  int i;
  rnnvarinfo *vi_local;
  rnndeccontext *ctx_local;
  
  if (vi->dead == 0) {
    for (local_24 = 0; local_24 < vi->varsetsnum; local_24 = local_24 + 1) {
      local_28 = 0;
      while ((local_28 < ctx->varsnum && (vi->varsets[local_24]->venum != ctx->vars[local_28]->en)))
      {
        local_28 = local_28 + 1;
      }
      if (local_28 == ctx->varsnum) {
        fprintf(_stderr,"I don\'t know which %s variant to use!\n",
                vi->varsets[local_24]->venum->name);
      }
      else if (vi->varsets[local_24]->variants[ctx->vars[local_28]->variant] == 0) {
        return 0;
      }
    }
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int rnndec_varmatch(struct rnndeccontext *ctx, struct rnnvarinfo *vi) {
	if (vi->dead)
		return 0;
	int i;
	for (i = 0; i < vi->varsetsnum; i++) {
		int j;
		for (j = 0; j < ctx->varsnum; j++)
			if (vi->varsets[i]->venum == ctx->vars[j]->en)
				break;
		if (j == ctx->varsnum) {
			fprintf (stderr, "I don't know which %s variant to use!\n", vi->varsets[i]->venum->name);
		} else {
			if (!vi->varsets[i]->variants[ctx->vars[j]->variant])
				return 0;
		}
	}
	return 1;
}